

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::pack_astc_block(uint32_t *pDst,astc_block_desc *pBlock,uint32_t uastc_mode)

{
  bool bVar1;
  byte bVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  int i;
  uint32_t codesize;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  byte *pbVar14;
  uint uVar15;
  uint8_t *puVar16;
  ulong uVar17;
  int bit_pos;
  byte local_ac [8];
  int local_a4;
  ulong *local_a0;
  uint32_t local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  ulong local_80;
  int ccs_bit_pos;
  undefined4 uStack_74;
  ulong uStack_70;
  undefined4 local_68;
  uint local_5c [3];
  astc_block_desc *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (0x12 < uastc_mode) {
    __assert_fail("uastc_mode < TOTAL_UASTC_MODES",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e73,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  bVar1 = pBlock->m_dual_plane;
  uVar3 = *(undefined4 *)(g_uastc_mode_astc_block_mode + (ulong)uastc_mode * 4);
  *(char *)pDst = (char)uVar3;
  *(char *)((long)pDst + 1) = (char)((uint)uVar3 >> 8);
  *(undefined8 *)((long)pDst + 2) = 0;
  pDst[2] = 0;
  pDst[3] = 0;
  bit_pos = 0xb;
  lVar6 = (long)pBlock->m_weight_range * 0xc;
  local_a0 = (ulong *)pDst;
  if ((*(int *)(g_astc_bise_range_table + lVar6 + 4) != 0) ||
     (*(int *)(g_astc_bise_range_table + lVar6 + 8) != 0)) {
    __assert_fail("!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2e82,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  local_80 = (ulong)*(uint *)(g_astc_bise_range_table + lVar6);
  iVar5 = 2;
  astc_set_bits_1_to_9(pDst,&bit_pos,pBlock->m_subsets - 1,2);
  if (pBlock->m_subsets == 1) {
    uVar10 = pBlock->m_cem;
    codesize = 4;
  }
  else {
    astc_set_bits(pDst,&bit_pos,pBlock->m_partition_seed,10);
    uVar10 = (pBlock->m_cem & 0xfU) << 2;
    codesize = 6;
  }
  astc_set_bits_1_to_9(pDst,&bit_pos,uVar10,codesize);
  if (pBlock->m_dual_plane == true) {
    iVar4 = (int)local_80 << (bVar1 + 4U & 0x1f);
    if (0x48 < iVar4 - 0x18U) {
      __assert_fail("(total_weight_bits >= 24) && (total_weight_bits <= 96)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                    ,0x2e99,
                    "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
    }
    _ccs_bit_pos = CONCAT44(uStack_74,0x7e - iVar4);
    astc_set_bits_1_to_9((uint32_t *)local_a0,&ccs_bit_pos,pBlock->m_ccs,2);
  }
  local_48 = (ulong)bVar1;
  iVar4 = ((pBlock->m_cem >> 2) + 1) * pBlock->m_subsets;
  if (9 < iVar4) {
    __assert_fail("num_cem_pairs <= 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ea0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  puVar16 = pBlock->m_endpoints;
  uVar15 = iVar4 * 2;
  uVar11 = (ulong)uVar15;
  local_a4 = bit_pos;
  _ccs_bit_pos = 0;
  uStack_70 = 0;
  local_68 = 0;
  lVar6 = (ulong)(byte)g_uastc_mode_endpoint_ranges[uastc_mode] * 0xc;
  uVar10 = *(uint32_t *)(g_astc_bise_range_table + lVar6);
  local_84 = *(int *)(g_astc_bise_range_table + lVar6 + 4);
  local_50 = pBlock;
  if (*(int *)(g_astc_bise_range_table + lVar6 + 4) == 0) {
    if (*(int *)(g_astc_bise_range_table + lVar6 + 8) == 0) {
      uVar17 = 0;
      if ((int)uVar15 < 1) {
        uVar11 = uVar17;
      }
      for (; uVar11 != uVar17; uVar17 = uVar17 + 1) {
        astc_set_bits_1_to_9((uint32_t *)&ccs_bit_pos,&local_a4,(uint)puVar16[uVar17],uVar10);
      }
      goto LAB_0012ff0a;
    }
    uVar13 = 3;
  }
  else {
    uVar13 = 5;
    iVar5 = 4;
  }
  bVar8 = (byte)uVar10;
  uVar17 = (long)(int)(iVar5 + uVar15) / (long)(int)uVar13;
  local_40 = uVar17 & 0xffffffff;
  local_88 = uVar10 + 3;
  local_8c = uVar10 * 2 + 3;
  local_90 = uVar10 * 2 + 5;
  local_94 = uVar10 * 3 + 5;
  local_98 = uVar10 * 3 + 7;
  uVar12 = (ulong)uVar13;
  if ((int)uVar17 < 1) {
    local_40 = 0;
  }
  uVar17 = 0;
  while( true ) {
    uVar7 = (long)(int)uVar11;
    if ((long)uVar12 <= (long)(int)uVar11) {
      uVar7 = uVar12;
    }
    if ((long)uVar7 < 1) {
      uVar7 = 0;
    }
    if (uVar17 == local_40) break;
    local_ac[4] = 0;
    local_ac[0] = 0;
    local_ac[1] = 0;
    local_ac[2] = 0;
    local_ac[3] = 0;
    for (uVar9 = 0; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      local_ac[uVar9] = puVar16[uVar9];
    }
    local_38 = uVar11;
    if (local_84 == 0) {
      pbVar14 = local_ac;
      iVar5 = 0;
      for (lVar6 = 0; lVar6 != 0xc; lVar6 = lVar6 + 4) {
        iVar5 = iVar5 + (uint)(*pbVar14 >> (bVar8 & 0x1f)) *
                        *(int *)((long)&astc_encode_quints(unsigned_int*,unsigned_char_const*,int&,int)
                                        ::s_muls + lVar6);
        *(uint *)((long)local_5c + lVar6) = (uint)*pbVar14 & ~(-1 << (bVar8 & 0x1f));
        pbVar14 = pbVar14 + 1;
      }
      if (0x7c < iVar5) {
        __assert_fail("quints < 125",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2e37,
                      "void basist::astc_encode_quints(uint32_t *, const uint8_t *, int &, int)");
      }
      bVar2 = g_astc_quint_encode[iVar5];
      astc_set_bits((uint32_t *)&ccs_bit_pos,&local_a4,
                    (bVar2 >> 5 & 3) << ((byte)local_94 & 0x1f) |
                    local_5c[2] << ((byte)local_90 & 0x1f) |
                    (bVar2 >> 3 & 3) << ((byte)local_8c & 0x1f) |
                    local_5c[1] << ((byte)local_88 & 0x1f) |
                    (bVar2 & 7) << (bVar8 & 0x1f) | local_5c[0],local_98);
    }
    else {
      astc_encode_trits((uint32_t *)&ccs_bit_pos,local_ac,&local_a4,uVar10);
    }
    uVar17 = uVar17 + 1;
    uVar11 = (ulong)((int)local_38 - uVar13);
    puVar16 = puVar16 + uVar12;
  }
LAB_0012ff0a:
  *local_a0 = *local_a0 | _ccs_bit_pos;
  local_a0[1] = local_a0[1] | uStack_70;
  if (4 < (int)local_80 - 1U) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x2ef0,
                  "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)");
  }
  uVar15 = (int)local_48 * 0x10 + 0x10;
  switch((int)local_80) {
  case 1:
    uVar11 = 0x7f;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3));
      *pbVar14 = *pbVar14 | local_50->m_weights[uVar17] << ((byte)uVar11 & 7);
      uVar11 = (ulong)((int)uVar11 - 1);
    }
    break;
  case 2:
    uVar11 = 0x7e;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3));
      *pbVar14 = *pbVar14 | ""[local_50->m_weights[uVar17]] << ((byte)uVar11 & 6);
      uVar11 = (ulong)((int)uVar11 - 2);
    }
    break;
  case 3:
    uVar11 = 0x7d;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      iVar5 = (uint)""[local_50->m_weights[uVar17]] << ((byte)uVar11 & 7);
      if (uVar17 == 0x2a) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ec9,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3));
      *pbVar14 = *pbVar14 | (byte)iVar5;
      if ((uint)uVar11 < 0x78) {
        pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3) + 1);
        *pbVar14 = *pbVar14 | (byte)((uint)iVar5 >> 8);
      }
      uVar11 = (ulong)((uint)uVar11 - 3);
    }
    break;
  case 4:
    puVar16 = local_50->m_weights;
    iVar5 = 0x7c;
    for (uVar11 = 0; uVar15 * 4 != uVar11; uVar11 = uVar11 + 4) {
      if (0x7c < (long)uVar11) {
LAB_00130124:
        __assert_fail("ofs >= 0 && (ofs >> 3) < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ed7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      if (0xf < iVar5 >> 3) goto LAB_00130124;
      pbVar14 = (byte *)((long)local_a0 + (ulong)(uint)(iVar5 >> 3));
      *pbVar14 = *pbVar14 | ""[*puVar16] << ((byte)iVar5 & 4);
      puVar16 = puVar16 + 1;
      iVar5 = iVar5 + -4;
    }
    break;
  case 5:
    uVar11 = 0x7b;
    for (uVar17 = 0; uVar15 != uVar17; uVar17 = uVar17 + 1) {
      iVar5 = (uint)""[local_50->m_weights[uVar17]] << ((byte)uVar11 & 7);
      if (uVar17 == 0x19) {
        __assert_fail("index < 16",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                      ,0x2ee7,
                      "bool basist::pack_astc_block(uint32_t *, const astc_block_desc *, uint32_t)")
        ;
      }
      pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3));
      *pbVar14 = *pbVar14 | (byte)iVar5;
      if ((uint)uVar11 < 0x78) {
        pbVar14 = (byte *)((long)local_a0 + (uVar11 >> 3) + 1);
        *pbVar14 = *pbVar14 | (byte)((uint)iVar5 >> 8);
      }
      uVar11 = (ulong)((uint)uVar11 - 5);
    }
  }
  return true;
}

Assistant:

bool pack_astc_block(uint32_t* pDst, const astc_block_desc* pBlock, uint32_t uastc_mode)
	{
		assert(uastc_mode < TOTAL_UASTC_MODES);
		uint8_t* pDst_bytes = reinterpret_cast<uint8_t*>(pDst);

		const int total_weights = pBlock->m_dual_plane ? 32 : 16;

		// Set mode bits - see Table 146-147
		uint32_t mode = g_uastc_mode_astc_block_mode[uastc_mode];
		pDst_bytes[0] = (uint8_t)mode;
		pDst_bytes[1] = (uint8_t)(mode >> 8);

		memset(pDst_bytes + 2, 0, 16 - 2);

		int bit_pos = ASTC_BLOCK_MODE_BITS;

		// We only support 1-5 bit weight indices
		assert(!g_astc_bise_range_table[pBlock->m_weight_range][1] && !g_astc_bise_range_table[pBlock->m_weight_range][2]);
		const int bits_per_weight = g_astc_bise_range_table[pBlock->m_weight_range][0];

		// See table 143 - PART
		astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_subsets - 1, ASTC_PART_BITS);

		if (pBlock->m_subsets == 1)
			astc_set_bits_1_to_9(pDst, bit_pos, pBlock->m_cem, ASTC_CEM_BITS);
		else
		{
			// See table 145
			astc_set_bits(pDst, bit_pos, pBlock->m_partition_seed, ASTC_PARTITION_INDEX_BITS);

			// Table 150 - we assume all CEM's are equal, so write 2 0's along with the CEM
			astc_set_bits_1_to_9(pDst, bit_pos, (pBlock->m_cem << 2) & 63, ASTC_CEM_BITS + 2);
		}

		if (pBlock->m_dual_plane)
		{
			const int total_weight_bits = total_weights * bits_per_weight;

			// See Illegal Encodings 23.24
			// https://www.khronos.org/registry/DataFormat/specs/1.3/dataformat.1.3.inline.html#_illegal_encodings
			assert((total_weight_bits >= 24) && (total_weight_bits <= 96));

			int ccs_bit_pos = 128 - total_weight_bits - ASTC_CCS_BITS;
			astc_set_bits_1_to_9(pDst, ccs_bit_pos, pBlock->m_ccs, ASTC_CCS_BITS);
		}

		const int num_cem_pairs = (1 + (pBlock->m_cem >> 2)) * pBlock->m_subsets;
		assert(num_cem_pairs <= 9);

		astc_pack_bise(pDst, pBlock->m_endpoints, bit_pos, num_cem_pairs * 2, g_uastc_mode_endpoint_ranges[uastc_mode]);

		// Write the weight bits in reverse bit order.
		switch (bits_per_weight)
		{
		case 1:
		{
			const uint32_t N = 1;
			for (int i = 0; i < total_weights; i++)
			{
				const uint32_t ofs = 128 - N - i;
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (pBlock->m_weights[i] << (ofs & 7));
			}
			break;
		}
		case 2:
		{
			const uint32_t N = 2;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits2[4] = { 0, 2, 1, 3 };
				const uint32_t ofs = 128 - N - (i * N);
				assert((ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits2[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 3:
		{
			const uint32_t N = 3;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits3[8] = { 0, 4, 2, 6, 1, 5, 3, 7 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits3[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}
			break;
		}
		case 4:
		{
			const uint32_t N = 4;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits4[16] = { 0, 8, 4, 12, 2, 10, 6, 14, 1, 9, 5, 13, 3, 11, 7, 15 };
				const int ofs = 128 - N - (i * N);
				assert(ofs >= 0 && (ofs >> 3) < 16);
				pDst_bytes[ofs >> 3] |= (s_reverse_bits4[pBlock->m_weights[i]] << (ofs & 7));
			}
			break;
		}
		case 5:
		{
			const uint32_t N = 5;
			for (int i = 0; i < total_weights; i++)
			{
				static const uint8_t s_reverse_bits5[32] = { 0, 16, 8, 24, 4, 20, 12, 28, 2, 18, 10, 26, 6, 22, 14, 30, 1, 17, 9, 25, 5, 21, 13, 29, 3, 19, 11, 27, 7, 23, 15, 31 };

				const uint32_t ofs = 128 - N - (i * N);
				const uint32_t rev = s_reverse_bits5[pBlock->m_weights[i]] << (ofs & 7);

				uint32_t index = ofs >> 3;
				assert(index < 16);
				pDst_bytes[index++] |= rev & 0xFF;
				if (index < 16)
					pDst_bytes[index++] |= (rev >> 8);
			}

			break;
		}
		default:
			assert(0);
			break;
		}

		return true;
	}